

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O1

cmCommand * __thiscall cmFunctionHelperCommand::Clone(cmFunctionHelperCommand *this)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  cmCommand *pcVar4;
  
  pcVar4 = (cmCommand *)operator_new(0xa0);
  pcVar4->Makefile = (cmMakefile *)0x0;
  (pcVar4->Error)._M_dataplus._M_p = (pointer)&(pcVar4->Error).field_2;
  (pcVar4->Error)._M_string_length = 0;
  (pcVar4->Error).field_2._M_local_buf[0] = '\0';
  pcVar4->_vptr_cmCommand = (_func_int **)&PTR__cmFunctionHelperCommand_0068e270;
  pcVar4[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar4[1].Makefile = (cmMakefile *)0x0;
  pcVar4[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar4[1].Error._M_string_length = 0;
  pcVar4[1].Error.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pcVar4[1].Error.field_2 + 8) = 0;
  pcVar4[2]._vptr_cmCommand = (_func_int **)0x0;
  pcVar4[2].Makefile = (cmMakefile *)0x0;
  pcVar4[2].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar4[2].Error._M_string_length = 0;
  pcVar4[2].Error.field_2._M_allocated_capacity = (size_type)(pcVar4 + 3);
  *(undefined8 *)((long)&pcVar4[2].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar4[3]._vptr_cmCommand = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pcVar4 + 1),&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
             &pcVar4[1].Error._M_string_length,&this->Functions);
  pcVar1 = (cmMakefile *)(this->Policies).Status.super__Base_bitset<4UL>._M_w[1];
  pcVar2 = (pointer)(this->Policies).Status.super__Base_bitset<4UL>._M_w[2];
  sVar3 = (this->Policies).Status.super__Base_bitset<4UL>._M_w[3];
  pcVar4[2]._vptr_cmCommand = (_func_int **)(this->Policies).Status.super__Base_bitset<4UL>._M_w[0];
  pcVar4[2].Makefile = pcVar1;
  pcVar4[2].Error._M_dataplus._M_p = pcVar2;
  pcVar4[2].Error._M_string_length = sVar3;
  std::__cxx11::string::_M_assign((string *)pcVar4[2].Error.field_2._M_local_buf);
  return pcVar4;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmFunctionHelperCommand* newC = new cmFunctionHelperCommand;
    // we must copy when we clone
    newC->Args = this->Args;
    newC->Functions = this->Functions;
    newC->Policies = this->Policies;
    newC->FilePath = this->FilePath;
    return newC;
  }